

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> * __thiscall
embree::XMLLoader::loadVec4iArray
          (vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *__return_storage_ptr__,
          XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  pointer pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  runtime_error *this_01;
  long lVar7;
  long lVar8;
  size_t i;
  Ref<embree::XML> *pRVar9;
  allocator local_89;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *local_88;
  Ref<embree::XML> *local_80;
  int local_74;
  string local_70;
  string local_50;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_80 = xml;
    std::__cxx11::string::string((string *)&local_70,"ofs",&local_89);
    XML::parm(&local_50,this_00,&local_70);
    bVar2 = std::operator!=(&local_50,"");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    pRVar9 = local_80;
    local_88 = __return_storage_ptr__;
    if (bVar2) {
      loadBinary<std::vector<embree::Vec4<int>,std::allocator<embree::Vec4<int>>>>
                (__return_storage_ptr__,this,local_80);
      __return_storage_ptr__ = local_88;
    }
    else {
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar6 = ((long)(local_80->ptr->body).
                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(local_80->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x48;
      if ((uVar6 & 3) != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_70,&pRVar9->ptr->loc);
        std::operator+(&local_50,&local_70,": wrong vector<int4> body");
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::resize
                (__return_storage_ptr__,uVar6 >> 2);
      lVar7 = 0xc;
      lVar8 = 0;
      for (uVar6 = 0; __return_storage_ptr__ = local_88,
          uVar6 < (ulong)((long)(local_88->
                                super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_88->
                                super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1)
      {
        local_74 = Token::Int((Token *)((long)&((pRVar9->ptr->body).
                                                super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->ty +
                                       lVar8));
        iVar3 = Token::Int((Token *)((long)&(pRVar9->ptr->body).
                                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                            ._M_impl.super__Vector_impl_data._M_start[1].ty + lVar8)
                          );
        iVar4 = Token::Int((Token *)((long)&(pRVar9->ptr->body).
                                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                            ._M_impl.super__Vector_impl_data._M_start[2].ty + lVar8)
                          );
        iVar5 = Token::Int((Token *)((long)&(pRVar9->ptr->body).
                                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                            ._M_impl.super__Vector_impl_data._M_start[3].ty + lVar8)
                          );
        pVVar1 = (local_88->
                 super__Vector_base<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        *(int *)((long)pVVar1 + lVar7 + -0xc) = local_74;
        *(int *)((long)pVVar1 + lVar7 + -8) = iVar3;
        *(int *)((long)pVVar1 + lVar7 + -4) = iVar4;
        *(int *)((long)&pVVar1->field_0 + lVar7) = iVar5;
        lVar7 = lVar7 + 0x10;
        lVar8 = lVar8 + 0x120;
        pRVar9 = local_80;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec4i> XMLLoader::loadVec4iArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec4i>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec4i>>(xml);
    } 
    else 
    {
      std::vector<Vec4i> data;
      if (xml->body.size() % 4 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<int4> body");
      data.resize(xml->body.size()/4);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec4i(xml->body[4*i+0].Int(),xml->body[4*i+1].Int(),xml->body[4*i+2].Int(),xml->body[4*i+3].Int());
      return data;
    }
  }